

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

iterator * __thiscall cppcms::form::iterator::operator=(iterator *this,iterator *other)

{
  iterator *in_RSI;
  iterator *in_RDI;
  
  if (in_RDI != in_RSI) {
    std::stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::operator=
              (&in_RSI->return_positions_,&in_RDI->return_positions_);
    in_RDI->current_ = in_RSI->current_;
    in_RDI->offset_ = in_RSI->offset_;
    booster::copy_ptr<cppcms::form::iterator::_data>::operator=
              ((copy_ptr<cppcms::form::iterator::_data> *)this,
               (copy_ptr<cppcms::form::iterator::_data> *)other);
  }
  return in_RDI;
}

Assistant:

form::iterator const &form::iterator::operator=(form::iterator const &other)
{
	if(this != &other) {
		return_positions_ = other.return_positions_;
		current_ = other.current_;
		offset_=other.offset_;
		d=other.d;
	}
	return *this;
}